

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SixAxisForceTorqueSensor.cpp
# Opt level: O3

void __thiscall
iDynTree::SixAxisForceTorqueSensor::SixAxisForceTorqueSensor(SixAxisForceTorqueSensor *this)

{
  SixAxisForceTorqueSensorPrivateAttributes *pSVar1;
  
  (this->super_JointSensor).super_Sensor._vptr_Sensor =
       (_func_int **)&PTR__SixAxisForceTorqueSensor_001858e0;
  pSVar1 = (SixAxisForceTorqueSensorPrivateAttributes *)operator_new(0x160);
  (pSVar1->name)._M_dataplus._M_p = (pointer)&(pSVar1->name).field_2;
  (pSVar1->name)._M_string_length = 0;
  (pSVar1->name).field_2._M_local_buf[0] = '\0';
  iDynTree::Transform::Transform(&pSVar1->link1_H_sensor);
  iDynTree::Transform::Transform(&pSVar1->link2_H_sensor);
  (pSVar1->parent_junction_name)._M_dataplus._M_p = (pointer)&(pSVar1->parent_junction_name).field_2
  ;
  (pSVar1->parent_junction_name)._M_string_length = 0;
  (pSVar1->parent_junction_name).field_2._M_local_buf[0] = '\0';
  (pSVar1->link1Name)._M_dataplus._M_p = (pointer)&(pSVar1->link1Name).field_2;
  (pSVar1->link1Name)._M_string_length = 0;
  (pSVar1->link1Name).field_2._M_local_buf[0] = '\0';
  (pSVar1->link2Name)._M_dataplus._M_p = (pointer)&(pSVar1->link2Name).field_2;
  (pSVar1->link2Name)._M_string_length = 0;
  (pSVar1->link2Name).field_2._M_local_buf[0] = '\0';
  this->pimpl = pSVar1;
  std::__cxx11::string::_M_replace((ulong)pSVar1,0,(char *)(pSVar1->name)._M_string_length,0x16f785)
  ;
  pSVar1 = this->pimpl;
  *(undefined4 *)&pSVar1->link1 = 0xffffffff;
  *(undefined4 *)((long)&pSVar1->link1 + 4) = 0xffffffff;
  *(undefined4 *)&pSVar1->link2 = 0xffffffff;
  *(undefined4 *)((long)&pSVar1->link2 + 4) = 0xffffffff;
  pSVar1->appliedWrenchLink = -1;
  return;
}

Assistant:

SixAxisForceTorqueSensor::SixAxisForceTorqueSensor()
{
    this->pimpl = new SixAxisForceTorqueSensorPrivateAttributes;

    this->pimpl->name = "";
    this->pimpl->link1 = this->pimpl->link2 = this->pimpl->appliedWrenchLink = -1;
}